

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HiResTimer.cpp
# Opt level: O0

double PlatformAgnostic::DateTime::GetSystemTimeREAL(void)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  tm *ptVar4;
  undefined4 *puVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int new_sec;
  int old_sec;
  size_t milliseconds;
  time_t tStack_58;
  int timeofday_retval;
  time_t time_now;
  timeval timeval;
  tm utc_tm;
  
  tStack_58 = time((time_t *)0x0);
  iVar3 = gettimeofday((timeval *)&time_now,(__timezone_ptr_t)0x0);
  ptVar4 = gmtime_r(&stack0xffffffffffffffa8,(tm *)&timeval.tv_usec);
  if (ptVar4 == (tm *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/PlatformAgnostic/Platform/Common/HiResTimer.cpp"
                       ,0x27,"(false)","gmtime() failed");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  _new_sec = 0;
  if ((iVar3 != -1) &&
     (_new_sec = (ulong)((double)timeval.tv_sec / 1000.0),
     _new_sec = _new_sec |
                (long)((double)timeval.tv_sec / 1000.0 - 9.223372036854776e+18) &
                (long)_new_sec >> 0x3f, (int)timeval.tv_usec != (int)(time_now % 0x3c))) {
    _new_sec = 999;
  }
  auVar8._8_4_ = (int)(_new_sec >> 0x20);
  auVar8._0_8_ = _new_sec;
  auVar8._12_4_ = 0x45300000;
  dVar7 = (double)(int)timeval.tv_usec * 1000.0 +
          (double)utc_tm.tm_sec * 3600000.0 + (double)timeval.tv_usec._4_4_ * 60000.0 +
          (auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)_new_sec) - 4503599627370496.0);
  uVar6 = (ulong)dVar7;
  uVar6 = uVar6 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f;
  auVar9._8_4_ = (int)(uVar6 >> 0x20);
  auVar9._0_8_ = uVar6;
  auVar9._12_4_ = 0x45300000;
  dVar7 = Js::DateUtilities::TvFromDate
                    ((double)(utc_tm.tm_mday + 0x76c),(double)utc_tm.tm_hour,
                     (double)(utc_tm.tm_min + -1),
                     (auVar9._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
  return dVar7;
}

Assistant:

inline static double GetSystemTimeREAL()
    {
#ifdef HAVE_WORKING_CLOCK_GETTIME
        struct timespec fast_time;
        // method below returns UTC time. So, nothing else is needed
        // we use clock_gettime first due to expectation of better accuracy
        if (clock_gettime(CLOCK_REALTIME, &fast_time) == 0)
        {
            return (fast_time.tv_sec * DateTimeTicks_PerSecond)
            + (int32_t) (fast_time.tv_nsec / 1e6);
        }
#endif
        // in case of clock_gettime fails we use the implementation below
        struct tm utc_tm;
        struct timeval timeval;
        time_t time_now = time(NULL);

        // gettimeofday return value needs to be converted to UTC time
        // see call below for gmtime_r
        int timeofday_retval = gettimeofday(&timeval,NULL);

        if (gmtime_r(&time_now, &utc_tm) == NULL)
        {
            AssertMsg(false, "gmtime() failed");
        }

        size_t milliseconds = 0;
        if(timeofday_retval != -1)
        {
            milliseconds = timeval.tv_usec / DateTimeTicks_PerSecond;

            int old_sec = utc_tm.tm_sec;
            int new_sec = timeval.tv_sec % 60; // C99 0-60 (1sec leap)

            // just in case we reached the next
            // second in the interval between time() and gettimeofday()
            if(old_sec != new_sec)
            {
                milliseconds = 999;
            }
        }

        milliseconds = (utc_tm.tm_hour * DateTimeTicks_PerHour)
                        + (utc_tm.tm_min * DateTimeTicks_PerMinute)
                        + (utc_tm.tm_sec * DateTimeTicks_PerSecond)
                        + milliseconds;

        return Js::DateUtilities::TvFromDate(1900 + utc_tm.tm_year, utc_tm.tm_mon,
                                            utc_tm.tm_mday - 1, milliseconds);
    }